

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

string * __thiscall
tinyusdz::value::print_array_snipped<std::array<tinyusdz::value::half,2ul>>
          (string *__return_storage_ptr__,value *this,array<tinyusdz::value::half,_2UL> *vals,
          size_t n,size_t N)

{
  array<tinyusdz::value::half,_2UL> *paVar1;
  size_t i;
  array<tinyusdz::value::half,_2UL> *paVar2;
  size_t i_1;
  value *pvVar3;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (n == 0 || vals <= (array<tinyusdz::value::half,_2UL> *)(n * 2)) {
    ::std::operator<<(local_1a8,"[");
    for (paVar1 = (array<tinyusdz::value::half,_2UL> *)0x0; vals != paVar1;
        paVar1 = (array<tinyusdz::value::half,_2UL> *)((long)&paVar1->_M_elems[0].value + 1)) {
      if (paVar1 != (array<tinyusdz::value::half,_2UL> *)0x0) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::operator<<(local_1a8,(half2 *)this);
      this = this + 4;
    }
  }
  else {
    paVar1 = (array<tinyusdz::value::half,_2UL> *)((long)vals - n);
    if (vals < n) {
      n = (size_t)vals;
    }
    ::std::operator<<(local_1a8,"[");
    pvVar3 = this;
    for (paVar2 = (array<tinyusdz::value::half,_2UL> *)0x0;
        (array<tinyusdz::value::half,_2UL> *)n != paVar2;
        paVar2 = (array<tinyusdz::value::half,_2UL> *)((long)&paVar2->_M_elems[0].value + 1)) {
      if (paVar2 != (array<tinyusdz::value::half,_2UL> *)0x0) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::operator<<(local_1a8,(half2 *)pvVar3);
      pvVar3 = pvVar3 + 4;
    }
    if (n < paVar1) {
      n = (size_t)paVar1;
    }
    ::std::operator<<(local_1a8,", ..., ");
    pvVar3 = this + n * 4;
    for (paVar1 = (array<tinyusdz::value::half,_2UL> *)n; paVar1 < vals;
        paVar1 = (array<tinyusdz::value::half,_2UL> *)((long)&paVar1->_M_elems[0].value + 1)) {
      if (n < paVar1) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::operator<<(local_1a8,(half2 *)pvVar3);
      pvVar3 = pvVar3 + 4;
    }
  }
  ::std::operator<<(local_1a8,"]");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const T *vals, size_t n, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}